

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomposition.hpp
# Opt level: O2

bool __thiscall diy::detail::Div<int>::operator<(Div<int> *this,Div<int> rhs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  
  if (this->b_size == rhs.b_size) {
    iVar1 = this->nb;
    iVar3 = rhs.nb;
    bVar4 = SBORROW4(iVar1,iVar3);
    iVar2 = iVar1 - iVar3;
    if (iVar1 == iVar3) {
      bVar4 = SBORROW4(this->dim,rhs.dim);
      iVar2 = this->dim - rhs.dim;
    }
    return bVar4 != iVar2 < 0;
  }
  return rhs.b_size < this->b_size;
}

Assistant:

bool operator<(Div rhs) const
    {
        // sort on second value of the pair unless tied, in which case sort on first
        if (b_size == rhs.b_size)
        {
            if (nb == rhs.nb)
                return(dim < rhs.dim);
            return(nb < rhs.nb);
        }
        return(b_size > rhs.b_size);
    }